

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3MatchEName(ExprList_item *pItem,char *zCol,char *zTab,char *zDb)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uchar uVar4;
  ulong uVar5;
  uchar uVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  
  if ((*(ushort *)&(pItem->fg).field_0x1 & 3) != 2) {
    return 0;
  }
  uVar8 = 1;
  pbVar3 = (byte *)pItem->zEName;
  while( true ) {
    pbVar7 = pbVar3 + 1;
    if ((*pbVar3 == 0) || (*pbVar3 == 0x2e)) break;
    uVar8 = uVar8 + 1;
    pbVar3 = pbVar7;
  }
  if (zDb == (char *)0x0) {
LAB_0018fcf6:
    uVar8 = 1;
    for (pbVar3 = pbVar3 + 2; (pbVar3[-1] != 0 && (pbVar3[-1] != 0x2e)); pbVar3 = pbVar3 + 1) {
      uVar8 = uVar8 + 1;
    }
    if (zTab != (char *)0x0) {
      if (uVar8 != 1) {
        uVar11 = uVar8 & 0xffffffff;
        pbVar9 = (byte *)zTab;
        do {
          if ((ulong)*pbVar7 == 0) {
            uVar6 = ""[*pbVar9];
            uVar4 = '\0';
LAB_0018fd66:
            if (uVar4 != uVar6) goto LAB_0018fd75;
            break;
          }
          uVar4 = ""[*pbVar7];
          uVar6 = ""[*pbVar9];
          if (uVar4 != uVar6) goto LAB_0018fd66;
          pbVar7 = pbVar7 + 1;
          pbVar9 = pbVar9 + 1;
          uVar12 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar12;
        } while (1 < uVar12);
      }
      if (zTab[uVar8 - 1] != '\0') goto LAB_0018fd75;
    }
    iVar2 = 1;
    if (zCol != (char *)0x0) {
      do {
        bVar1 = *pbVar3;
        if (bVar1 == *zCol) {
          if ((ulong)bVar1 == 0) {
            return 1;
          }
        }
        else if (""[bVar1] != ""[(byte)*zCol]) goto LAB_0018fd75;
        zCol = (char *)((byte *)zCol + 1);
        pbVar3 = pbVar3 + 1;
      } while( true );
    }
  }
  else {
    if (uVar8 != 1) {
      lVar10 = 0;
      uVar11 = uVar8 & 0xffffffff;
      do {
        uVar5 = (ulong)(byte)pItem->zEName[lVar10];
        if (uVar5 == 0) {
          uVar6 = ""[(byte)zDb[lVar10]];
          uVar4 = '\0';
LAB_0018fcdf:
          if (uVar4 != uVar6) {
            return 0;
          }
          break;
        }
        uVar4 = ""[uVar5];
        uVar6 = ""[(byte)zDb[lVar10]];
        if (uVar4 != uVar6) goto LAB_0018fcdf;
        uVar12 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar12;
        lVar10 = lVar10 + 1;
      } while (1 < uVar12);
    }
    if (zDb[uVar8 - 1] == '\0') goto LAB_0018fcf6;
LAB_0018fd75:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3MatchEName(
  const struct ExprList_item *pItem,
  const char *zCol,
  const char *zTab,
  const char *zDb
){
  int n;
  const char *zSpan;
  if( pItem->fg.eEName!=ENAME_TAB ) return 0;
  zSpan = pItem->zEName;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zDb && (sqlite3StrNICmp(zSpan, zDb, n)!=0 || zDb[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  for(n=0; ALWAYS(zSpan[n]) && zSpan[n]!='.'; n++){}
  if( zTab && (sqlite3StrNICmp(zSpan, zTab, n)!=0 || zTab[n]!=0) ){
    return 0;
  }
  zSpan += n+1;
  if( zCol && sqlite3StrICmp(zSpan, zCol)!=0 ){
    return 0;
  }
  return 1;
}